

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O3

wstring * __thiscall
Excel::loadString_abi_cxx11_
          (wstring *__return_storage_ptr__,Excel *this,Stream *stream,
          vector<int,_std::allocator<int>_> *borders,int32_t lengthFieldSize,BiffVersion biffVer)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  void *pvVar2;
  wstring *pwVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  Exception *this_00;
  int32_t bytes;
  size_t i;
  size_type sVar5;
  long lVar6;
  long lVar7;
  size_t dummySize;
  size_type sVar8;
  char options;
  int16_t charactersCount;
  int16_t formattingRuns;
  int32_t extStringLength;
  vector<char,_std::allocator<char>_> dummy;
  vector<unsigned_short,_std::allocator<unsigned_short>_> stringData;
  byte local_83;
  short local_82;
  allocator_type local_7f;
  short local_7e;
  int local_7c;
  vector<char,_std::allocator<char>_> local_78;
  int32_t local_5c;
  wstring local_58;
  wstring *local_38;
  
  local_82 = 0;
  local_83 = 0;
  local_7e = 0;
  local_7c = 0;
  Stream::read<short>((Stream *)this,&local_82,(int32_t)borders);
  if (local_82 < 0x100 || lengthFieldSize != 0x500) {
    local_5c = lengthFieldSize;
    if (lengthFieldSize == 0x600) {
      Stream::read<char>((Stream *)this,(char *)&local_83,1);
      if ((local_83 & 8) != 0) {
        Stream::read<short>((Stream *)this,&local_7e,2);
      }
      if ((local_83 & 4) != 0) {
        Stream::read<int>((Stream *)this,&local_7c,4);
      }
      bytes = (local_83 & 1) + 1;
    }
    else {
      bytes = 1;
    }
    local_38 = __return_storage_ptr__;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_58,(long)local_82,
               (allocator_type *)&local_78);
    if (0 < local_82) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (**(code **)(*(long *)this + 0x28))(this);
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (stream->_vptr_Stream,*(undefined8 *)&stream->m_byteOrder,&local_78);
        if (_Var4._M_current != *(int **)&stream->m_byteOrder) {
          Stream::read<char>((Stream *)this,(char *)&local_83,1);
          bytes = 1;
          if (local_5c == 0x600) {
            bytes = (local_83 & 1) + 1;
          }
        }
        Stream::read<unsigned_short>
                  ((Stream *)this,(unsigned_short *)((long)local_58._M_dataplus._M_p + lVar7),bytes)
        ;
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 2;
      } while (lVar6 < local_82);
    }
    pwVar3 = local_38;
    if (0 < (long)local_7e) {
      sVar8 = (long)local_7e * 4;
      std::vector<char,_std::allocator<char>_>::vector(&local_78,sVar8,&local_7f);
      sVar5 = 0;
      do {
        Stream::read<char>((Stream *)this,
                           (char *)(CONCAT44(local_78.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start._4_4_,
                                             local_78.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start._0_4_) + sVar5),1);
        sVar5 = sVar5 + 1;
      } while (sVar8 != sVar5);
      pvVar2 = (void *)CONCAT44(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
    }
    sVar5 = (size_type)local_7c;
    if (0 < (long)sVar5) {
      std::vector<char,_std::allocator<char>_>::vector(&local_78,sVar5,&local_7f);
      sVar8 = 0;
      do {
        Stream::read<char>((Stream *)this,
                           (char *)(CONCAT44(local_78.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start._4_4_,
                                             local_78.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start._0_4_) + sVar8),1);
        sVar8 = sVar8 + 1;
      } while (sVar5 != sVar8);
      pvVar2 = (void *)CONCAT44(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
    }
    paVar1 = &pwVar3->field_2;
    (pwVar3->_M_dataplus)._M_p = (pointer)paVar1;
    pwVar3->_M_string_length = 0;
    (pwVar3->field_2)._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((wstring *)pwVar3,paVar1,paVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
    if (local_58._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_58._M_dataplus._M_p,
                      local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
    }
    return pwVar3;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_58,L"Wrong format of XLS file.",L"");
  Exception::Exception(this_00,&local_58);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline std::wstring
loadString( Stream & stream,
	const std::vector< int32_t > & borders,
	int32_t lengthFieldSize = 2,
	BOF::BiffVersion biffVer = BOF::BIFF8 )
{
	int16_t charactersCount = 0;
	char options = 0;
	int16_t formattingRuns = 0;
	int32_t extStringLength = 0;

	stream.read( charactersCount, lengthFieldSize );

	if( biffVer == BOF::BIFF7 && charactersCount > 255 )
		throw Exception( L"Wrong format of XLS file." );

	if( biffVer == BOF::BIFF8 )
	{
		stream.read( options, 1 );

		if( isRichString( options ) )
			stream.read( formattingRuns, 2 );

		if( isExtString( options ) )
			stream.read( extStringLength, 4 );
	}

	int16_t bytesPerChar = ( biffVer == BOF::BIFF8 ? ( isHighByte( options ) ? 2 : 1 ) : 1 );

	std::vector< uint16_t > stringData( charactersCount );

	for( int16_t i = 0; i < charactersCount; ++i )
	{
		if( isSkipByte( stream.pos(), borders ) )
		{
			stream.read( options, 1 );
			bytesPerChar = ( biffVer == BOF::BIFF8 ? ( isHighByte( options ) ? 2 : 1 ) : 1 );
		}

		stream.read( stringData[ i ], bytesPerChar );
	}

	if( formattingRuns > 0 )
	{
		const size_t dummySize = formattingRuns * 4;
		std::vector< char > dummy( dummySize );

		for( size_t i = 0; i < dummySize; ++i )
			stream.read( dummy[ i ], 1 );
	}

	if( extStringLength > 0 )
	{
		const size_t dummySize = extStringLength;
		std::vector< char > dummy( dummySize );

		for( size_t i = 0; i < dummySize; ++i )
			stream.read( dummy[ i ], 1 );
	}

	std::wstring str;
	str.assign( stringData.begin(), stringData.end() );

	return str;
}